

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffuselight.hpp
# Opt level: O2

Color __thiscall
DiffuseLight::sampleIrradiance
          (DiffuseLight *this,point *surface,vec3f *dirToLight,float *dist,Sampler *sampler)

{
  vec3f vVar1;
  vec3f vVar2;
  Color CVar3;
  SampleInfo info;
  vec3f local_50;
  vec3f local_44;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  float fVar4;
  
  (*this->base->_vptr_Primitive[2])(&local_44,this->base,sampler);
  vVar1 = operator-(&local_44,surface);
  *dist = SQRT(vVar1.z * vVar1.z + vVar1.x * vVar1.x + vVar1.y * vVar1.y);
  local_50 = operator-(&local_44,surface);
  vVar1 = normalized(&local_50);
  *dirToLight = vVar1;
  vVar2 = operator-(&local_44,surface);
  local_2c = ((vVar1.z * local_30 + local_38 * vVar1.x + vVar1.y * local_34) /
             (vVar2.z * vVar2.z + vVar2.x * vVar2.x + vVar2.y * vVar2.y)) / local_2c;
  if (this->sampleside == 0) {
    local_2c = ABS(local_2c);
  }
  else {
    local_2c = local_2c * (float)this->sampleside;
    if (local_2c <= 0.0) {
      local_2c = 0.0;
    }
  }
  vVar1 = operator*(local_2c,(vec3f *)&(this->super_Light).field_0xc);
  CVar3.x = vVar1.x;
  CVar3.y = vVar1.y;
  register0x00001240 = vVar1.z;
  return CVar3;
}

Assistant:

Color sampleIrradiance(const point& surface, vec3f& dirToLight, float& dist, Sampler& sampler) const
	{
		assert(samplable);
		auto info = base->sampleSurface(sampler);
		dist = norm(info.p - surface);
		dirToLight = normalized(info.p - surface);
		float t = dot(info.normal, dirToLight) / sqrlen(info.p - surface) / info.pdf;
		t = sampleside? fmax(t*sampleside, 0): fabs(t);
		return t * _radiance;
	}